

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::CategoricalMapping::clear_int64tostringmap(CategoricalMapping *this)

{
  ulong uVar1;
  Int64ToStringMap *this_00;
  undefined8 *puVar2;
  
  if (this->_oneof_case_[0] == 2) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 == (undefined8 *)0x0) {
      this_00 = (this->MappingType_).int64tostringmap_;
      if (this_00 != (Int64ToStringMap *)0x0) {
        Int64ToStringMap::~Int64ToStringMap(this_00);
      }
      operator_delete(this_00,0x48);
    }
    this->_oneof_case_[0] = 0;
  }
  return;
}

Assistant:

inline bool CategoricalMapping::_internal_has_int64tostringmap() const {
  return MappingType_case() == kInt64ToStringMap;
}